

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_members_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_MembersTest_::
BeginEnd<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(BeginEnd<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [16];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var20;
  uint uVar21;
  char *pcVar22;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator it;
  TypeParam t;
  key_equal local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  iterator local_508;
  iterator local_4d8;
  allocator_type local_4a0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_498;
  
  pcVar22 = (char *)0x0;
  local_508.inner_end_._4_4_ = (undefined4)((ulong)local_508.inner_ >> 0x20);
  local_508._0_12_ = ZEXT812(0);
  local_4d8.inner_end_ = local_4d8.inner_;
  local_4d8.inner_ =
       (Inner *)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (WithId<phmap::priv::StatefulTestingEqual>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_4a0.id_ = 0;
  _Var20._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&local_498;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)_Var20._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(pair<const_phmap::priv::hash_internal::EnumClass,_int> *)&local_508,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)((long)&local_508 + 0x10),0,
             (hasher *)&local_4d8,&local_518,&local_4a0);
  local_508.it_.field_1.slot_ = local_498.sets_._M_elems[0].set_.slots_;
  if (local_498.sets_._M_elems[0].set_.ctrl_ != (char *)0x0) {
    cVar1 = *local_498.sets_._M_elems[0].set_.ctrl_;
    pcVar22 = local_498.sets_._M_elems[0].set_.ctrl_;
    while (cVar1 < -1) {
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar22 < (char)iVar7);
      in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar7 >> 8));
      in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar7 >> 0x10));
      in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar7 >> 0x18));
      in_XMM1_Be = -(pcVar22[4] < (char)iVar8);
      in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Bi = -(pcVar22[8] < (char)iVar9);
      in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar10);
      in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar3[1] = in_XMM1_Bb;
      auVar3[0] = in_XMM1_Ba;
      auVar3[2] = in_XMM1_Bc;
      auVar3[3] = in_XMM1_Bd;
      auVar3[4] = in_XMM1_Be;
      auVar3[5] = in_XMM1_Bf;
      auVar3[6] = in_XMM1_Bg;
      auVar3[7] = in_XMM1_Bh;
      auVar3[8] = in_XMM1_Bi;
      auVar3[9] = in_XMM1_Bj;
      auVar3[10] = in_XMM1_Bk;
      auVar3[0xb] = in_XMM1_Bl;
      auVar3[0xc] = in_XMM1_Bm;
      auVar3[0xd] = in_XMM1_Bn;
      auVar3[0xe] = in_XMM1_Bo;
      auVar3[0xf] = in_XMM1_Bp;
      auVar4[1] = in_XMM1_Bb;
      auVar4[0] = in_XMM1_Ba;
      auVar4[2] = in_XMM1_Bc;
      auVar4[3] = in_XMM1_Bd;
      auVar4[4] = in_XMM1_Be;
      auVar4[5] = in_XMM1_Bf;
      auVar4[6] = in_XMM1_Bg;
      auVar4[7] = in_XMM1_Bh;
      auVar4[8] = in_XMM1_Bi;
      auVar4[9] = in_XMM1_Bj;
      auVar4[10] = in_XMM1_Bk;
      auVar4[0xb] = in_XMM1_Bl;
      auVar4[0xc] = in_XMM1_Bm;
      auVar4[0xd] = in_XMM1_Bn;
      auVar4[0xe] = in_XMM1_Bo;
      auVar4[0xf] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Bd;
      auVar17[0] = in_XMM1_Bc;
      auVar17[2] = in_XMM1_Be;
      auVar17[3] = in_XMM1_Bf;
      auVar17[4] = in_XMM1_Bg;
      auVar17[5] = in_XMM1_Bh;
      auVar17[6] = in_XMM1_Bi;
      auVar17[7] = in_XMM1_Bj;
      auVar17[8] = in_XMM1_Bk;
      auVar17[9] = in_XMM1_Bl;
      auVar17[10] = in_XMM1_Bm;
      auVar17[0xb] = in_XMM1_Bn;
      auVar17[0xc] = in_XMM1_Bo;
      auVar17[0xd] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Be;
      auVar15[0] = in_XMM1_Bd;
      auVar15[2] = in_XMM1_Bf;
      auVar15[3] = in_XMM1_Bg;
      auVar15[4] = in_XMM1_Bh;
      auVar15[5] = in_XMM1_Bi;
      auVar15[6] = in_XMM1_Bj;
      auVar15[7] = in_XMM1_Bk;
      auVar15[8] = in_XMM1_Bl;
      auVar15[9] = in_XMM1_Bm;
      auVar15[10] = in_XMM1_Bn;
      auVar15[0xb] = in_XMM1_Bo;
      auVar15[0xc] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bf;
      auVar13[0] = in_XMM1_Be;
      auVar13[2] = in_XMM1_Bg;
      auVar13[3] = in_XMM1_Bh;
      auVar13[4] = in_XMM1_Bi;
      auVar13[5] = in_XMM1_Bj;
      auVar13[6] = in_XMM1_Bk;
      auVar13[7] = in_XMM1_Bl;
      auVar13[8] = in_XMM1_Bm;
      auVar13[9] = in_XMM1_Bn;
      auVar13[10] = in_XMM1_Bo;
      auVar13[0xb] = in_XMM1_Bp;
      auVar11[1] = in_XMM1_Bg;
      auVar11[0] = in_XMM1_Bf;
      auVar11[2] = in_XMM1_Bh;
      auVar11[3] = in_XMM1_Bi;
      auVar11[4] = in_XMM1_Bj;
      auVar11[5] = in_XMM1_Bk;
      auVar11[6] = in_XMM1_Bl;
      auVar11[7] = in_XMM1_Bm;
      auVar11[8] = in_XMM1_Bn;
      auVar11[9] = in_XMM1_Bo;
      auVar11[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      local_508.it_.field_1.slot_ = local_508.it_.field_1.slot_ + uVar2;
      cVar1 = pcVar22[uVar2];
      pcVar22 = pcVar22 + uVar2;
    }
  }
  local_508.it_.ctrl_ = pcVar22;
  local_508.it_end_.ctrl_ =
       local_498.sets_._M_elems[0].set_.ctrl_ + local_498.sets_._M_elems[0].set_.capacity_;
  local_508.inner_end_ = (Inner *)&stack0xffffffffffffffe8;
  local_508.inner_ =
       (Inner *)_Var20._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  if (pcVar22 == local_508.it_end_.ctrl_) {
    do {
      local_508.inner_ =
           (Inner *)((long)_Var20._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x48);
      if (local_508.inner_ == local_508.inner_end_) {
        local_508.inner_ = (Inner *)0x0;
        break;
      }
      local_508.it_ =
           raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::begin((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                    *)local_508.inner_);
      local_508.it_end_.ctrl_ =
           *(ctrl_t **)local_508.inner_ + *(size_t *)((long)local_508.inner_ + 0x18);
      _Var20._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_508.inner_;
    } while (local_508.it_.ctrl_ == local_508.it_end_.ctrl_);
  }
  _Var20._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&local_498;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::begin((const_iterator *)&local_4d8,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           *)_Var20._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::
  CmpHelperEQ<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::const_iterator>
            ((internal *)&local_518,"t.begin()","t.cbegin()",&local_508,(const_iterator *)&local_4d8
            );
  if (local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_508);
    if (local_510 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = (local_510->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x54,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_508.inner_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(ctrl_t **)local_508.inner_ + 8))();
    }
  }
  if (local_510 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_510,local_510);
  }
  local_508.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_508._0_16_ = (pair<const_phmap::priv::hash_internal::EnumClass,_int>)0x0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_508.it_.field_1;
  local_508.it_ = (EmbeddedIterator)(auVar19 << 0x40);
  local_4d8.it_.ctrl_ = (ctrl_t *)0x0;
  local_4d8.inner_ = (Inner *)0x0;
  local_4d8.inner_end_ = (Inner *)0x0;
  local_4d8.it_end_.ctrl_ = (ctrl_t *)0x0;
  testing::internal::
  CmpHelperEQ<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::const_iterator>
            ((internal *)&local_518,"t.end()","t.cend()",&local_508,(const_iterator *)&local_4d8);
  if (local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_508);
    if (local_510 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = (local_510->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x55,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_508.inner_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_508.inner_ + 8))();
    }
  }
  if (local_510 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_510,local_510);
  }
  if (local_498.sets_._M_elems[0].set_.ctrl_ == (char *)0x0) {
    local_508.it_.ctrl_ = (char *)0x0;
  }
  else {
    cVar1 = *local_498.sets_._M_elems[0].set_.ctrl_;
    local_508.it_.ctrl_ = local_498.sets_._M_elems[0].set_.ctrl_;
    while (cVar1 < -1) {
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*local_508.it_.ctrl_ < (char)iVar7);
      in_XMM1_Bb = -(local_508.it_.ctrl_[1] < (char)((uint)iVar7 >> 8));
      in_XMM1_Bc = -(local_508.it_.ctrl_[2] < (char)((uint)iVar7 >> 0x10));
      in_XMM1_Bd = -(local_508.it_.ctrl_[3] < (char)((uint)iVar7 >> 0x18));
      in_XMM1_Be = -(local_508.it_.ctrl_[4] < (char)iVar8);
      in_XMM1_Bf = -(local_508.it_.ctrl_[5] < (char)((uint)iVar8 >> 8));
      in_XMM1_Bg = -(local_508.it_.ctrl_[6] < (char)((uint)iVar8 >> 0x10));
      in_XMM1_Bh = -(local_508.it_.ctrl_[7] < (char)((uint)iVar8 >> 0x18));
      in_XMM1_Bi = -(local_508.it_.ctrl_[8] < (char)iVar9);
      in_XMM1_Bj = -(local_508.it_.ctrl_[9] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bk = -(local_508.it_.ctrl_[10] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bl = -(local_508.it_.ctrl_[0xb] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Bm = -(local_508.it_.ctrl_[0xc] < (char)iVar10);
      in_XMM1_Bn = -(local_508.it_.ctrl_[0xd] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bo = -(local_508.it_.ctrl_[0xe] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bp = -(local_508.it_.ctrl_[0xf] < (char)((uint)iVar10 >> 0x18));
      auVar5[1] = in_XMM1_Bb;
      auVar5[0] = in_XMM1_Ba;
      auVar5[2] = in_XMM1_Bc;
      auVar5[3] = in_XMM1_Bd;
      auVar5[4] = in_XMM1_Be;
      auVar5[5] = in_XMM1_Bf;
      auVar5[6] = in_XMM1_Bg;
      auVar5[7] = in_XMM1_Bh;
      auVar5[8] = in_XMM1_Bi;
      auVar5[9] = in_XMM1_Bj;
      auVar5[10] = in_XMM1_Bk;
      auVar5[0xb] = in_XMM1_Bl;
      auVar5[0xc] = in_XMM1_Bm;
      auVar5[0xd] = in_XMM1_Bn;
      auVar5[0xe] = in_XMM1_Bo;
      auVar5[0xf] = in_XMM1_Bp;
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bd;
      auVar18[0] = in_XMM1_Bc;
      auVar18[2] = in_XMM1_Be;
      auVar18[3] = in_XMM1_Bf;
      auVar18[4] = in_XMM1_Bg;
      auVar18[5] = in_XMM1_Bh;
      auVar18[6] = in_XMM1_Bi;
      auVar18[7] = in_XMM1_Bj;
      auVar18[8] = in_XMM1_Bk;
      auVar18[9] = in_XMM1_Bl;
      auVar18[10] = in_XMM1_Bm;
      auVar18[0xb] = in_XMM1_Bn;
      auVar18[0xc] = in_XMM1_Bo;
      auVar18[0xd] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Be;
      auVar16[0] = in_XMM1_Bd;
      auVar16[2] = in_XMM1_Bf;
      auVar16[3] = in_XMM1_Bg;
      auVar16[4] = in_XMM1_Bh;
      auVar16[5] = in_XMM1_Bi;
      auVar16[6] = in_XMM1_Bj;
      auVar16[7] = in_XMM1_Bk;
      auVar16[8] = in_XMM1_Bl;
      auVar16[9] = in_XMM1_Bm;
      auVar16[10] = in_XMM1_Bn;
      auVar16[0xb] = in_XMM1_Bo;
      auVar16[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bg;
      auVar12[0] = in_XMM1_Bf;
      auVar12[2] = in_XMM1_Bh;
      auVar12[3] = in_XMM1_Bi;
      auVar12[4] = in_XMM1_Bj;
      auVar12[5] = in_XMM1_Bk;
      auVar12[6] = in_XMM1_Bl;
      auVar12[7] = in_XMM1_Bm;
      auVar12[8] = in_XMM1_Bn;
      auVar12[9] = in_XMM1_Bo;
      auVar12[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar2 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      local_498.sets_._M_elems[0].set_.slots_ = local_498.sets_._M_elems[0].set_.slots_ + uVar2;
      cVar1 = local_508.it_.ctrl_[uVar2];
      local_508.it_.ctrl_ = local_508.it_.ctrl_ + uVar2;
    }
  }
  local_508.it_.field_1.slot_ = local_498.sets_._M_elems[0].set_.slots_;
  local_508.it_end_.ctrl_ =
       local_498.sets_._M_elems[0].set_.ctrl_ + local_498.sets_._M_elems[0].set_.capacity_;
  local_508.inner_end_ = (Inner *)&stack0xffffffffffffffe8;
  local_508.inner_ =
       (Inner *)_Var20._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  if (local_508.it_.ctrl_ == local_508.it_end_.ctrl_) {
    do {
      local_508.inner_ =
           (Inner *)((long)_Var20._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x48);
      if (local_508.inner_ == local_508.inner_end_) {
        local_508.inner_ = (Inner *)0x0;
        break;
      }
      local_508.it_ =
           raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::begin((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                    *)local_508.inner_);
      local_508.it_end_.ctrl_ =
           (ctrl_t *)(*(long *)local_508.inner_ + *(size_t *)((long)local_508.inner_ + 0x18));
      _Var20._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_508.inner_;
    } while (local_508.it_.ctrl_ == local_508.it_end_.ctrl_);
  }
  local_4d8.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_4d8.inner_ = (Inner *)0x0;
  local_4d8.inner_end_ = (Inner *)0x0;
  local_4d8.it_.ctrl_ = (ctrl_t *)0x0;
  testing::internal::
  CmpHelperNE<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::iterator>
            ((internal *)&local_518,"t.begin()","t.end()",&local_508,&local_4d8);
  if (local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_508);
    if (local_510 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = (local_510->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x56,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if (&(local_508.inner_)->set_ !=
        (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *)0x0) {
      (**(code **)(((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
                     *)&(local_508.inner_)->set_)->_M_elems[0].set_.ctrl_ + 8))();
    }
  }
  if (local_510 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_510,local_510);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::begin((const_iterator *)&local_508,&local_498);
  local_4d8.inner_ = (Inner *)0x0;
  local_4d8.inner_end_ = (Inner *)0x0;
  local_4d8.it_.ctrl_ = (ctrl_t *)0x0;
  local_4d8.it_end_.ctrl_ = (ctrl_t *)0x0;
  testing::internal::
  CmpHelperNE<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::const_iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>::const_iterator>
            ((internal *)&local_518,"t.cbegin()","t.cend()",(const_iterator *)&local_508,
             (const_iterator *)&local_4d8);
  if (local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_508);
    if (local_510 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = (local_510->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x57,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d8,(Message *)&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_508.inner_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_508.inner_ + 8))();
    }
  }
  if (local_510 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_510,local_510);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_498);
  return;
}

Assistant:

TYPED_TEST_P(MembersTest, BeginEnd) {
  TypeParam t = {typename TypeParam::value_type{}};
  EXPECT_EQ(t.begin(), t.cbegin());
  EXPECT_EQ(t.end(), t.cend());
  EXPECT_NE(t.begin(), t.end());
  EXPECT_NE(t.cbegin(), t.cend());
}